

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void xPredIntraAngAdi_X(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int local_7c;
  int local_78;
  int local_74;
  int pred_width;
  int idx;
  int c4;
  int c3;
  int c2;
  int c1;
  int width2;
  int offset;
  int j;
  int i;
  int height_local;
  int width_local;
  int mode_local;
  int i_dst_local;
  pel *dst_local;
  pel *src_local;
  int iTempDn;
  int ishift;
  int imult;
  
  iVar2 = width * 2;
  _mode_local = dst;
  for (width2 = 0; width2 < height; width2 = width2 + 1) {
    iVar3 = (int)tab_auc_dir_dxdy[0][mode][0];
    bVar1 = tab_auc_dir_dxdy[0][mode][1];
    local_74 = (width2 + 1) * iVar3 >> (bVar1 & 0x1f);
    iVar3 = ((width2 + 1) * iVar3 * 0x20 >> (bVar1 & 0x1f)) + local_74 * -0x20;
    local_7c = width;
    if ((iVar2 - local_74) + 1 <= width) {
      local_7c = (iVar2 - local_74) + 1;
    }
    local_78 = local_7c;
    for (offset = 0; offset < local_7c; offset = offset + 1) {
      _mode_local[offset] =
           (pel)((int)((uint)src[local_74] * (0x20 - iVar3) +
                       (uint)src[local_74 + 1] * (0x40 - iVar3) +
                       (uint)src[local_74 + 2] * (iVar3 + 0x20) + (uint)src[local_74 + 3] * iVar3 +
                      0x40) >> 7);
      local_74 = local_74 + 1;
    }
    if (local_7c < 1) {
      *_mode_local = (pel)((int)((uint)src[iVar2] * (0x20 - iVar3) +
                                 (uint)src[iVar2 + 1] * (0x40 - iVar3) +
                                 (uint)src[iVar2 + 2] * (iVar3 + 0x20) +
                                 (uint)src[iVar2 + 3] * iVar3 + 0x40) >> 7);
      local_78 = 1;
    }
    for (; offset < width; offset = offset + 1) {
      _mode_local[offset] = _mode_local[local_78 + -1];
    }
    _mode_local = _mode_local + i_dst;
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_X(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    int i, j;
    int offset;
    int width2 = width << 1;

    for (j = 0; j < height; j++) {
        int c1, c2, c3, c4;
        int idx = getContextPixel(mode, 0, j + 1, &offset);
        int pred_width = COM_MIN(width, width2 - idx + 1);

        c1 = 32 - offset;
        c2 = 64 - offset;
        c3 = 32 + offset;
        c4 = offset;

        for (i = 0; i < pred_width; i++, idx++) {
            dst[i] = (src[idx] * c1 + src[idx + 1] * c2 + src[idx + 2] * c3 + src[idx + 3] * c4 + 64) >> 7;
        }
        if (pred_width <= 0) {
            dst[0] = (src[width2] * c1 + src[width2 + 1] * c2 + src[width2 + 2] * c3 + src[width2 + 3] * c4 + 64) >> 7;
            pred_width = 1;
        }
        for (; i < width; i++) {
            dst[i] = dst[pred_width - 1];
        }
        dst += i_dst;
    }
}